

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O2

FT_Bool tt_face_get_colr_glyph_paint
                  (TT_Face face,FT_UInt base_glyph,FT_Color_Root_Transform root_transform,
                  FT_OpaquePaint *opaque_paint)

{
  ushort uVar1;
  short *psVar2;
  long lVar3;
  FT_Byte *pFVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  psVar2 = (short *)face->colr;
  if (psVar2 == (short *)0x0) {
    return '\0';
  }
  if ((((*(long *)(psVar2 + 0x40) != 0) && (*psVar2 != 0)) &&
      (uVar5 = *(ulong *)(psVar2 + 0xc), uVar5 != 0)) &&
     (lVar3 = *(long *)(psVar2 + 0x10), lVar3 != 0)) {
    uVar7 = 0;
    if (opaque_paint->p != (FT_Byte *)0x0) goto LAB_00208486;
    do {
      while( true ) {
        uVar8 = (uint)uVar5 - uVar7;
        if ((uint)uVar5 < uVar7 || uVar8 == 0) goto LAB_00208484;
        uVar6 = (uVar8 >> 1) + uVar7;
        uVar1 = *(ushort *)(lVar3 + 4 + (ulong)(uVar6 * 6));
        uVar8 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
        if (base_glyph <= uVar8) break;
        uVar7 = uVar6 + 1;
      }
      uVar5 = (ulong)uVar6;
    } while (base_glyph < uVar8);
    uVar7 = *(uint *)(lVar3 + 6 + (ulong)(uVar6 * 6));
    uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    if (((uVar7 != 0) && ((ulong)uVar7 <= *(ulong *)(psVar2 + 0x44))) &&
       (pFVar4 = (FT_Byte *)(lVar3 + (ulong)uVar7),
       pFVar4 < (FT_Byte *)(*(long *)(psVar2 + 0x40) + *(ulong *)(psVar2 + 0x44)))) {
      opaque_paint->p = pFVar4;
      opaque_paint->insert_root_transform = root_transform == FT_COLOR_INCLUDE_ROOT_TRANSFORM;
      uVar7 = 1;
      goto LAB_00208486;
    }
  }
LAB_00208484:
  uVar7 = 0;
LAB_00208486:
  return (FT_Bool)uVar7;
}

Assistant:

FT_LOCAL_DEF( FT_Bool )
  tt_face_get_colr_glyph_paint( TT_Face                  face,
                                FT_UInt                  base_glyph,
                                FT_Color_Root_Transform  root_transform,
                                FT_OpaquePaint*          opaque_paint )
  {
    Colr*              colr = (Colr*)face->colr;
    BaseGlyphV1Record  base_glyph_v1_record;
    FT_Byte*           p;

    if ( !colr || !colr->table )
      return 0;

    if ( colr->version < 1 || !colr->num_base_glyphs_v1 ||
         !colr->base_glyphs_v1 )
      return 0;

    if ( opaque_paint->p )
      return 0;

    if ( !find_base_glyph_v1_record( colr->base_glyphs_v1,
                                     colr->num_base_glyphs_v1,
                                     base_glyph,
                                     &base_glyph_v1_record ) )
      return 0;

    if ( !base_glyph_v1_record.paint_offset                   ||
         base_glyph_v1_record.paint_offset > colr->table_size )
      return 0;

    p = (FT_Byte*)( colr->base_glyphs_v1 +
                    base_glyph_v1_record.paint_offset );
    if ( p >= ( (FT_Byte*)colr->table + colr->table_size ) )
      return 0;

    opaque_paint->p = p;

    if ( root_transform == FT_COLOR_INCLUDE_ROOT_TRANSFORM )
      opaque_paint->insert_root_transform = 1;
    else
      opaque_paint->insert_root_transform = 0;

    return 1;
  }